

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::udivrem(APInt *LHS,APInt *RHS,APInt *Quotient,APInt *Remainder)

{
  uint numBits;
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  APInt local_40;
  
  numBits = LHS->BitWidth;
  if (numBits != RHS->BitWidth) {
    __assert_fail("LHS.BitWidth == RHS.BitWidth && \"Bit widths must be the same\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x6b5,
                  "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                 );
  }
  if (numBits < 0x41) {
    uVar1 = (RHS->U).VAL;
    if (uVar1 == 0) {
      __assert_fail("RHS.U.VAL != 0 && \"Divide by zero?\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x6ba,
                    "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                   );
    }
    uVar2 = (LHS->U).VAL;
    APInt(&local_40,numBits,uVar2 / uVar1,false);
    operator=(Quotient,&local_40);
    ~APInt(&local_40);
    APInt(&local_40,numBits,uVar2 % uVar1,false);
    operator=(Remainder,&local_40);
  }
  else {
    uVar4 = getActiveBits(LHS);
    uVar5 = getActiveBits(RHS);
    if (uVar5 == 0) {
      __assert_fail("rhsWords && \"Performing divrem operation by zero ???\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                    ,0x6c6,
                    "static void llvm::APInt::udivrem(const APInt &, const APInt &, APInt &, APInt &)"
                   );
    }
    if (uVar4 == 0) {
      APInt(&local_40,numBits,0,false);
      operator=(Quotient,&local_40);
      ~APInt(&local_40);
      APInt(&local_40,numBits,0,false);
      Quotient = Remainder;
    }
    else {
      if (uVar5 == 1) {
        operator=(Quotient,LHS);
        APInt(&local_40,numBits,0,false);
        operator=(Remainder,&local_40);
        ~APInt(&local_40);
      }
      uVar4 = (uint)((ulong)uVar4 + 0x3f >> 6);
      uVar5 = (uint)((ulong)uVar5 + 0x3f >> 6);
      if ((uVar4 < uVar5) || (bVar3 = ult(LHS,RHS), bVar3)) {
        operator=(Remainder,LHS);
        APInt(&local_40,numBits,0,false);
      }
      else {
        bVar3 = operator==(LHS,RHS);
        if (!bVar3) {
          reallocate(Quotient,numBits);
          reallocate(Remainder,numBits);
          if (uVar4 == 1) {
            uVar1 = *(LHS->U).pVal;
            uVar2 = *(RHS->U).pVal;
            operator=(Quotient,uVar1 / uVar2);
            operator=(Remainder,uVar1 % uVar2);
            return;
          }
          divide((LHS->U).pVal,uVar4,(RHS->U).pVal,uVar5,(Quotient->U).pVal,(Remainder->U).pVal);
          iVar6 = (int)((ulong)numBits + 0x3f >> 6);
          memset((void *)((ulong)(uVar4 * 8) + (long)(Quotient->U).pVal),0,
                 (ulong)((iVar6 - uVar4) * 8));
          memset((void *)((ulong)(uVar5 * 8) + (long)(Remainder->U).pVal),0,
                 (ulong)((iVar6 - uVar5) * 8));
          return;
        }
        APInt(&local_40,numBits,1,false);
        operator=(Quotient,&local_40);
        ~APInt(&local_40);
        APInt(&local_40,numBits,0,false);
        Quotient = Remainder;
      }
    }
    operator=(Quotient,&local_40);
  }
  ~APInt(&local_40);
  return;
}

Assistant:

void APInt::udivrem(const APInt &LHS, const APInt &RHS,
                    APInt &Quotient, APInt &Remainder) {
  assert(LHS.BitWidth == RHS.BitWidth && "Bit widths must be the same");
  unsigned BitWidth = LHS.BitWidth;

  // First, deal with the easy case
  if (LHS.isSingleWord()) {
    assert(RHS.U.VAL != 0 && "Divide by zero?");
    uint64_t QuotVal = LHS.U.VAL / RHS.U.VAL;
    uint64_t RemVal = LHS.U.VAL % RHS.U.VAL;
    Quotient = APInt(BitWidth, QuotVal);
    Remainder = APInt(BitWidth, RemVal);
    return;
  }

  // Get some size facts about the dividend and divisor
  unsigned lhsWords = getNumWords(LHS.getActiveBits());
  unsigned rhsBits  = RHS.getActiveBits();
  unsigned rhsWords = getNumWords(rhsBits);
  assert(rhsWords && "Performing divrem operation by zero ???");

  // Check the degenerate cases
  if (lhsWords == 0) {
    Quotient = APInt(BitWidth, 0);    // 0 / Y ===> 0
    Remainder = APInt(BitWidth, 0);   // 0 % Y ===> 0
    return;
  }

  if (rhsBits == 1) {
    Quotient = LHS;                   // X / 1 ===> X
    Remainder = APInt(BitWidth, 0);   // X % 1 ===> 0
  }

  if (lhsWords < rhsWords || LHS.ult(RHS)) {
    Remainder = LHS;                  // X % Y ===> X, iff X < Y
    Quotient = APInt(BitWidth, 0);    // X / Y ===> 0, iff X < Y
    return;
  }

  if (LHS == RHS) {
    Quotient  = APInt(BitWidth, 1);   // X / X ===> 1
    Remainder = APInt(BitWidth, 0);   // X % X ===> 0;
    return;
  }

  // Make sure there is enough space to hold the results.
  // NOTE: This assumes that reallocate won't affect any bits if it doesn't
  // change the size. This is necessary if Quotient or Remainder is aliased
  // with LHS or RHS.
  Quotient.reallocate(BitWidth);
  Remainder.reallocate(BitWidth);

  if (lhsWords == 1) { // rhsWords is 1 if lhsWords is 1.
    // There is only one word to consider so use the native versions.
    uint64_t lhsValue = LHS.U.pVal[0];
    uint64_t rhsValue = RHS.U.pVal[0];
    Quotient = lhsValue / rhsValue;
    Remainder = lhsValue % rhsValue;
    return;
  }

  // Okay, lets do it the long way
  divide(LHS.U.pVal, lhsWords, RHS.U.pVal, rhsWords, Quotient.U.pVal,
         Remainder.U.pVal);
  // Clear the rest of the Quotient and Remainder.
  std::memset(Quotient.U.pVal + lhsWords, 0,
              (getNumWords(BitWidth) - lhsWords) * APINT_WORD_SIZE);
  std::memset(Remainder.U.pVal + rhsWords, 0,
              (getNumWords(BitWidth) - rhsWords) * APINT_WORD_SIZE);
}